

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase_p.h
# Opt level: O2

void __thiscall QtFontStyle::QtFontStyle(QtFontStyle *this,Key *k)

{
  Key::Key(&this->key,k);
  *(undefined8 *)((long)&(this->styleName).d.d + 4) = 0;
  *(undefined8 *)((long)&(this->styleName).d.ptr + 4) = 0;
  *(undefined8 *)&this->field_0x4 = 0;
  *(undefined8 *)((long)&this->pixelSizes + 4) = 0;
  *(undefined4 *)((long)&(this->styleName).d.size + 4) = 0;
  return;
}

Assistant:

QtFontStyle(const Key &k)
        : key(k)
        , bitmapScalable(false)
        , smoothScalable(false)
        , count(0)
        , pixelSizes(nullptr)
    {
    }